

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O1

size_t __thiscall
embree::FastAllocator::Block::getFreeBytes(Block *this,AllocationType atype,bool huge_pages)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = 0;
  do {
    if (atype == ANY_TYPE) {
LAB_00c5ef7c:
      uVar1 = (this->allocEnd).super___atomic_base<unsigned_long>._M_i;
      uVar3 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
      uVar1 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      uVar1 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      uVar5 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 < uVar5) {
        uVar5 = uVar1;
      }
      sVar4 = (uVar3 + sVar4) - uVar5;
    }
    else {
      if (this->atype == EMBREE_OS_MALLOC) {
        bVar2 = this->huge_pages == huge_pages && atype == EMBREE_OS_MALLOC;
      }
      else {
        bVar2 = this->atype == atype;
      }
      if (bVar2) goto LAB_00c5ef7c;
    }
    this = this->next;
    if (this == (Block *)0x0) {
      return sVar4;
    }
  } while( true );
}

Assistant:

size_t getFreeBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockFreeBytes();
        }
        return bytes;
      }